

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::EdgeChainSimplifier::AssignDegenerateEdges
          (EdgeChainSimplifier *this,vector<int,_std::allocator<int>_> *degenerate_ids,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *merged_ids)

{
  int iVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar2;
  bool bVar3;
  int iVar4;
  reference this_00;
  iterator __first;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  iterator __first_00;
  iterator __last;
  reference piVar8;
  const_reference pvVar9;
  reference puVar10;
  reference pvVar11;
  ostream *poVar12;
  S2LogMessage local_f8;
  S2LogMessageVoidify local_e1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  **local_d8;
  uint *local_d0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> it;
  int layer;
  InputEdgeId degenerate_id;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  value_type_conflict2 local_7c;
  value_type_conflict2 local_78;
  int i;
  undefined1 local_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  vector<int,_std::allocator<int>_> *ids;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *merged_ids_local;
  vector<int,_std::allocator<int>_> *degenerate_ids_local;
  EdgeChainSimplifier *this_local;
  
  __range1 = merged_ids;
  merged_ids_local =
       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        *)degenerate_ids;
  degenerate_ids_local = (vector<int,_std::allocator<int>_> *)this;
  __end1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin(merged_ids);
  ids = (vector<int,_std::allocator<int>_> *)
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::end(merged_ids);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                     *)&ids), bVar3) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator*(&__end1);
    __first = std::vector<int,_std::allocator<int>_>::begin(this_00);
    order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<int,_std::allocator<int>_>::end(this_00);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  sVar5 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(__range1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,sVar5);
  for (local_78 = 0; uVar6 = (ulong)(int)local_78,
      sVar5 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(__range1), uVar6 < sVar5; local_78 = local_78 + 1) {
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](__range1,(long)(int)local_78);
    bVar3 = std::vector<int,_std::allocator<int>_>::empty(pvVar7);
    if (!bVar3) {
      local_7c = local_78;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,&local_7c);
    }
  }
  __first_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,S2Builder::EdgeChainSimplifier::AssignDegenerateEdges(std::vector<int,std::allocator<int>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)const::__0>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first_00._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current,(anon_class_8_1_5cac7ce3)&__range1);
  pvVar2 = merged_ids_local;
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)merged_ids_local);
  _layer = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)pvVar2);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &layer);
    if (!bVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
      return;
    }
    piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1_1);
    it._M_current._4_4_ = *piVar8;
    it._M_current._0_4_ = input_edge_layer(this,it._M_current._4_4_);
    local_c8._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    local_d0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    local_d8 = &__range1;
    local_c0 = std::
               upper_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int,S2Builder::EdgeChainSimplifier::AssignDegenerateEdges(std::vector<int,std::allocator<int>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)const::__1>
                         (local_c8,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    )local_d0,(int *)((long)&it._M_current + 4),
                          (anon_class_8_1_5cac7ce3_for__M_comp)local_d8);
    local_e0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
    bVar3 = __gnu_cxx::operator!=(&local_c0,&local_e0);
    pvVar2 = __range1;
    if (bVar3) {
      puVar10 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator[](&local_c0,-1);
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](pvVar2,(ulong)*puVar10);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,0);
      iVar1 = *pvVar11;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this->layer_begins_,(long)(int)it._M_current);
      if (*pvVar9 <= iVar1) {
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator--(&local_c0);
      }
    }
    pvVar2 = __range1;
    iVar1 = (int)it._M_current;
    puVar10 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator[](&local_c0,0);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](pvVar2,(ulong)*puVar10);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,0);
    iVar4 = input_edge_layer(this,*pvVar11);
    pvVar2 = __range1;
    if (iVar1 != iVar4) break;
    puVar10 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator[](&local_c0,0);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](pvVar2,(ulong)*puVar10);
    std::vector<int,_std::allocator<int>_>::push_back
              (pvVar7,(value_type_conflict1 *)((long)&it._M_current + 4));
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x721,kFatal,(ostream *)&std::cerr);
  poVar12 = S2LogMessage::stream(&local_f8);
  poVar12 = std::operator<<(poVar12,
                            "Check failed: (layer) == (input_edge_layer((*merged_ids)[it[0]][0])) ")
  ;
  S2LogMessageVoidify::operator&(&local_e1,poVar12);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_f8);
}

Assistant:

void S2Builder::EdgeChainSimplifier::AssignDegenerateEdges(
    const vector<InputEdgeId>& degenerate_ids,
    vector<vector<InputEdgeId>>* merged_ids) const {
  // Each degenerate edge is assigned to an output edge in the appropriate
  // layer.  If there is more than one candidate, we use heuristics so that if
  // the input consists of a chain of edges provided in consecutive order
  // (some of which became degenerate), then all those input edges are
  // assigned to the same output edge.  For example, suppose that one output
  // edge is labeled with input edges 3,4,7,8, while another output edge is
  // labeled with input edges 50,51,54,57.  Then if we encounter degenerate
  // edges labeled with input edges 5 and 6, we would prefer to assign them to
  // the first edge (yielding the continuous range 3,4,5,6,7,8).
  //
  // The heuristic below is only smart enough to handle the case where the
  // candidate output edges have non-overlapping ranges of input edges.
  // (Otherwise there is probably not a good heuristic for assigning the
  // degenerate edges in any case.)

  // Duplicate edge ids don't affect the heuristic below, so we don't bother
  // removing them.  (They will be removed by IdSetLexicon::Add.)
  for (auto& ids : *merged_ids) std::sort(ids.begin(), ids.end());

  // Sort the output edges by their minimum input edge id.  This is sufficient
  // for the purpose of determining which layer they belong to.  With
  // EdgeType::UNDIRECTED, some edges might not have any input edge ids (i.e.,
  // if they consist entirely of siblings of input edges).  We simply remove
  // such edges from the lists of candidates.
  vector<unsigned> order;
  order.reserve(merged_ids->size());
  for (int i = 0; i < merged_ids->size(); ++i) {
    if (!(*merged_ids)[i].empty()) order.push_back(i);
  }
  std::sort(order.begin(), order.end(), [&merged_ids](int i, int j) {
      return (*merged_ids)[i][0] < (*merged_ids)[j][0];
    });

  // Now determine where each degenerate edge should be assigned.
  for (InputEdgeId degenerate_id : degenerate_ids) {
    int layer = input_edge_layer(degenerate_id);

    // Find the first output edge whose range of input edge ids starts after
    // "degenerate_id".  If the previous edge belongs to the correct layer,
    // then we assign the degenerate edge to it.
    auto it = std::upper_bound(order.begin(), order.end(), degenerate_id,
                               [&merged_ids](InputEdgeId x, unsigned y) {
                                 return x < (*merged_ids)[y][0];
                               });
    if (it != order.begin()) {
      if ((*merged_ids)[it[-1]][0] >= layer_begins_[layer]) --it;
    }
    S2_DCHECK_EQ(layer, input_edge_layer((*merged_ids)[it[0]][0]));
    (*merged_ids)[it[0]].push_back(degenerate_id);
  }
}